

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

void __thiscall
Darts::Details::AutoPool<unsigned_int>::resize_buf(AutoPool<unsigned_int> *this,size_t size)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  
  sVar6 = size;
  if (size < this->capacity_ * 2) {
    uVar3 = 1;
    do {
      sVar6 = uVar3;
      uVar3 = sVar6 * 2;
    } while (sVar6 < size);
  }
  pcVar4 = (char *)operator_new__(sVar6 * 4);
  sVar1 = this->size_;
  if (sVar1 != 0) {
    pcVar2 = (this->buf_).array_;
    sVar5 = 0;
    do {
      *(undefined4 *)(pcVar4 + sVar5 * 4) = *(undefined4 *)(pcVar2 + sVar5 * 4);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  pcVar2 = (this->buf_).array_;
  (this->buf_).array_ = pcVar4;
  this->capacity_ = sVar6;
  if (pcVar2 == (char *)0x0) {
    return;
  }
  operator_delete__(pcVar2);
  return;
}

Assistant:

void AutoPool<T>::resize_buf(std::size_t size) {
  std::size_t capacity;
  if (size >= capacity_ * 2) {
    capacity = size;
  } else {
    capacity = 1;
    while (capacity < size) {
      capacity <<= 1;
    }
  }

  AutoArray<char> buf;
  try {
    buf.reset(new char[sizeof(T) * capacity]);
  } catch (const std::bad_alloc &) {
    DARTS_THROW("failed to resize pool: std::bad_alloc");
  }

  if (size_ > 0) {
    T *src = reinterpret_cast<T *>(&buf_[0]);
    T *dest = reinterpret_cast<T *>(&buf[0]);
    for (std::size_t i = 0; i < size_; ++i) {
      new(&dest[i]) T(src[i]);
      src[i].~T();
    }
  }

  buf_.swap(&buf);
  capacity_ = capacity;
}